

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  bool bVar1;
  cmGeneratorTarget *this_00;
  pointer this_01;
  string *psVar2;
  cmGlobalNinjaGenerator *pcVar3;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string output;
  undefined1 local_60 [8];
  string input;
  string macdir;
  char *pkgloc_local;
  cmSourceFile *source_local;
  MacOSXContentGeneratorType *this_local;
  
  this_00 = GetGeneratorTarget(this->Generator);
  bVar1 = cmGeneratorTarget::IsBundleOnApple(this_00);
  if (bVar1) {
    this_01 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
              operator->(&this->Generator->OSXBundleGenerator);
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              ((string *)((long)&input.field_2 + 8),this_01,pkgloc);
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)local_60,(string *)psVar2);
    pcVar3 = GetGlobalGenerator(this->Generator);
    psVar2 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar3,(string *)local_60);
    std::__cxx11::string::operator=((string *)local_60,(string *)psVar2);
    std::__cxx11::string::string((string *)local_90,(string *)(input.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_90,"/");
    cmsys::SystemTools::GetFilenameName(&local_b0,(string *)local_60);
    std::__cxx11::string::operator+=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    pcVar3 = GetGlobalGenerator(this->Generator);
    psVar2 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar3,(string *)local_90);
    std::__cxx11::string::operator=((string *)local_90,(string *)psVar2);
    pcVar3 = GetGlobalGenerator(this->Generator);
    std::__cxx11::string::string((string *)&local_d0,(string *)local_60);
    std::__cxx11::string::string((string *)&local_f0,(string *)local_90);
    cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar3,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Generator->ExtraFiles,(value_type *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(input,
                                                                 output);

  // Add as a dependency to the target so that it gets called.
  this->Generator->ExtraFiles.push_back(std::move(output));
}